

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypesHierarchy.cpp
# Opt level: O3

TYPE_ID __thiscall
TypesHierarchy::AddCompisite
          (TypesHierarchy *this,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *tmptypes)

{
  pointer pvVar1;
  pointer __s1;
  undefined1 __s2 [8];
  int iVar2;
  _Base_ptr p_Var3;
  pointer *ppuVar4;
  size_t __n;
  ulong uVar5;
  uint uVar6;
  size_t i;
  _Rb_tree_header *p_Var7;
  ulong uVar8;
  _Self __tmp;
  undefined1 auStack_48 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmprow;
  
  auStack_48 = (undefined1  [8])0x0;
  tmprow.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tmprow.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var3 = (tmptypes->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(tmptypes->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var7) {
    do {
      if (tmprow.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          tmprow.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)auStack_48,
                   (iterator)
                   tmprow.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,&p_Var3[1]._M_color);
      }
      else {
        *tmprow.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start = p_Var3[1]._M_color;
        tmprow.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             tmprow.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var7);
  }
  __s2 = auStack_48;
  uVar8 = (ulong)this->CompositeStartFrom;
  if (uVar8 != 0) {
    pvVar1 = (this->types).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(this->types).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
            -0x5555555555555555;
    if (uVar8 <= uVar5) {
      __n = (long)tmprow.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start - (long)auStack_48;
      ppuVar4 = (pointer *)
                ((long)&pvVar1[uVar8].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data + 8);
      do {
        __s1 = ((_Vector_impl_data *)(ppuVar4 + -1))->_M_start;
        if ((long)*ppuVar4 - (long)__s1 == __n) {
          if (*ppuVar4 == __s1) goto LAB_001341c2;
          iVar2 = bcmp(__s1,(void *)__s2,__n);
          if (iVar2 == 0) goto LAB_001341c2;
        }
        uVar8 = uVar8 + 1;
        ppuVar4 = ppuVar4 + 3;
      } while (uVar8 <= uVar5);
    }
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back(&this->types,(value_type *)auStack_48);
  uVar6 = (int)((ulong)((long)(this->types).
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->types).
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 - 1;
  uVar8 = (ulong)uVar6;
  if (this->CompositeStartFrom == 0) {
    this->CompositeStartFrom = uVar6;
  }
LAB_001341c2:
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48);
  }
  return (TYPE_ID)uVar8;
}

Assistant:

TYPE_ID TypesHierarchy::AddCompisite(set<TYPE_ID>* tmptypes) {
	TYPE_ID newType;
	set <TYPE_ID>::iterator it_type;
	vector<TYPE_ID> tmprow;

	for ( it_type = tmptypes->begin(); it_type != tmptypes->end(); it_type++)
		tmprow.push_back(*it_type);


	if (CompositeStartFrom != 0)
		for ( size_t i = CompositeStartFrom; i <= types.size(); i++)
			if( types[i] == tmprow ) return i;


	types.push_back(tmprow);
	newType = types.size()-1;

	if (CompositeStartFrom == 0) CompositeStartFrom = newType;
	return newType;
}